

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O0

void __thiscall
google::protobuf::internal::
KeyMapBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
InsertUnique(KeyMapBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *this,map_index_t b,KeyNode *node)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  LogMessage *pLVar2;
  uint *puVar3;
  NodeAndBucket NVar4;
  byte local_aa;
  basic_string_view<char,_std::char_traits<char>_> local_a8;
  LogMessageFatal local_98 [23];
  Voidify local_81;
  ViewType local_80;
  NodeBase *local_70;
  map_index_t local_68;
  byte local_49;
  basic_string_view<char,_std::char_traits<char>_> local_48;
  LogMessageFatal local_38 [23];
  Voidify local_21;
  NodeBase *local_20;
  KeyNode *node_local;
  KeyMapBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pKStack_10;
  map_index_t b_local;
  KeyMapBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_local;
  
  local_49 = 0;
  local_aa = 1;
  local_20 = &node->super_NodeBase;
  node_local._4_4_ = b;
  pKStack_10 = this;
  if ((this->super_UntypedMapBase).index_of_first_non_null_ !=
      (this->super_UntypedMapBase).num_buckets_) {
    bVar1 = internal::UntypedMapBase::TableEntryIsEmpty
                      (&this->super_UntypedMapBase,
                       (this->super_UntypedMapBase).index_of_first_non_null_);
    local_aa = bVar1 ^ 0xff;
  }
  if (((local_aa ^ 0xff) & 1) != 0) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_48,
               "index_of_first_non_null_ == num_buckets_ || !TableEntryIsEmpty(index_of_first_non_null_)"
              );
    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
              (local_38,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/map.h"
               ,0x3f7,local_48._M_len,local_48._M_str);
    local_49 = 1;
    pLVar2 = absl::lts_20240722::log_internal::LogMessage::InternalStream((LogMessage *)local_38);
    absl::lts_20240722::log_internal::Voidify::operator&&(&local_21,pLVar2);
  }
  if ((local_49 & 1) == 0) {
    this_00 = KeyNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::key((KeyNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)local_20);
    local_80 = (ViewType)std::__cxx11::string::operator_cast_to_basic_string_view((string *)this_00)
    ;
    NVar4 = FindHelper(this,local_80,(TreeIterator *)0x0);
    local_70 = NVar4.node;
    local_68 = NVar4.bucket;
    if (local_70 != (NodeBase *)0x0) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_a8,"FindHelper(node->key()).node == nullptr");
      absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                (local_98,
                 "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/map.h"
                 ,0x3fc,local_a8._M_len,local_a8._M_str);
      pLVar2 = absl::lts_20240722::log_internal::LogMessage::InternalStream((LogMessage *)local_98);
      absl::lts_20240722::log_internal::Voidify::operator&&(&local_81,pLVar2);
      absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_98);
    }
    bVar1 = internal::UntypedMapBase::TableEntryIsEmpty
                      (&this->super_UntypedMapBase,node_local._4_4_);
    if (bVar1) {
      internal::UntypedMapBase::InsertUniqueInList
                (&this->super_UntypedMapBase,node_local._4_4_,local_20);
      puVar3 = std::min<unsigned_int>
                         (&(this->super_UntypedMapBase).index_of_first_non_null_,
                          (uint *)((long)&node_local + 4));
      (this->super_UntypedMapBase).index_of_first_non_null_ = *puVar3;
    }
    else {
      bVar1 = internal::UntypedMapBase::TableEntryIsNonEmptyList
                        (&this->super_UntypedMapBase,node_local._4_4_);
      if (bVar1) {
        bVar1 = internal::UntypedMapBase::TableEntryIsTooLong
                          (&this->super_UntypedMapBase,node_local._4_4_);
        if (!bVar1) {
          internal::UntypedMapBase::InsertUniqueInList
                    (&this->super_UntypedMapBase,node_local._4_4_,local_20);
          return;
        }
      }
      internal::UntypedMapBase::InsertUniqueInTree
                (&this->super_UntypedMapBase,node_local._4_4_,NodeToVariantKey,local_20);
    }
    return;
  }
  absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_38);
}

Assistant:

void InsertUnique(map_index_t b, KeyNode* node) {
    ABSL_DCHECK(index_of_first_non_null_ == num_buckets_ ||
                !TableEntryIsEmpty(index_of_first_non_null_));
    // In practice, the code that led to this point may have already
    // determined whether we are inserting into an empty list, a short list,
    // or whatever.  But it's probably cheap enough to recompute that here;
    // it's likely that we're inserting into an empty or short list.
    ABSL_DCHECK(FindHelper(node->key()).node == nullptr);
    if (TableEntryIsEmpty(b)) {
      InsertUniqueInList(b, node);
      index_of_first_non_null_ = (std::min)(index_of_first_non_null_, b);
    } else if (TableEntryIsNonEmptyList(b) && !TableEntryIsTooLong(b)) {
      InsertUniqueInList(b, node);
    } else {
      InsertUniqueInTree(b, NodeToVariantKey, node);
    }
  }